

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstr.c
# Opt level: O0

uint8_t * bstr_parse_json_string_literal
                    (bstr_context_t *ctx,uint8_t *pBegin,uint8_t *pEnd,adt_str_t *str)

{
  byte bVar1;
  bool bVar2;
  byte *pbVar3;
  adt_error_t aVar4;
  int iVar5;
  int *piVar6;
  int local_68;
  adt_error_t result;
  int32_t i;
  byte local_5b;
  char local_5a;
  uint8_t c;
  uint32_t value;
  uint8_t numDigits;
  uint8_t escapeType;
  _Bool isEscapeSequence;
  uint8_t *pNext;
  byte abStack_48 [7];
  uint8_t firstChar;
  uint8_t escapeCharMap [8];
  uint8_t validEscapeChars [8];
  uint8_t horizontalTab;
  uint8_t carriageReturn;
  uint8_t linefeed;
  uint8_t formfeed;
  uint8_t backspace;
  uint8_t frontslash;
  uint8_t backslash;
  uint8_t quotationMark;
  adt_str_t *str_local;
  uint8_t *pEnd_local;
  uint8_t *pBegin_local;
  bstr_context_t *ctx_local;
  
  builtin_memcpy(escapeCharMap,"\"\\/bfnrt",8);
  _abStack_48 = 0x90d0a0c082f5c22;
  if ((((ctx == (bstr_context_t *)0x0) || (pBegin == (uint8_t *)0x0)) || (pEnd == (uint8_t *)0x0))
     || ((str == (adt_str_t *)0x0 || (pEnd < pBegin)))) {
    piVar6 = __errno_location();
    *piVar6 = 0x16;
    ctx_local = (bstr_context_t *)0x0;
  }
  else {
    ctx_local = (bstr_context_t *)pBegin;
    if ((pBegin < pEnd) && (*pBegin == '\"')) {
      bVar2 = false;
      local_5a = '\0';
      local_5b = 0;
      i = 0;
      _value = pBegin + 1;
      do {
        while( true ) {
          while( true ) {
            if (pEnd <= _value) {
              return pBegin;
            }
            pbVar3 = _value + 1;
            bVar1 = *_value;
            _value = pbVar3;
            if (!bVar2) break;
            if (local_5a == 'u') {
              if (local_5b < 4) {
                i = ASCIIHexToInt[bVar1] | i << 4;
                local_5b = local_5b + 1;
              }
              if (local_5b == 4) {
                adt_str_push(str,i);
                local_5a = '\0';
                local_5b = 0;
                i = 0;
              }
            }
            else if (bVar1 == 0x75) {
              local_5a = 'u';
            }
            else {
              for (local_68 = 0; (local_68 < 8 && (bVar1 != escapeCharMap[local_68]));
                  local_68 = local_68 + 1) {
              }
              if (7 < local_68) {
                bstr_set_error(ctx,4);
                return (uint8_t *)0x0;
              }
              adt_str_push(str,(uint)abStack_48[local_68]);
              bVar2 = false;
            }
          }
          if (bVar1 == 0x22) {
            return pbVar3;
          }
          if (bVar1 != 0x5c) break;
          bVar2 = true;
        }
        iVar5 = bstr_pred_is_control_char((uint)bVar1);
        if (iVar5 != 0) {
          bstr_set_error(ctx,4);
          return (uint8_t *)0x0;
        }
        aVar4 = adt_str_push(str,(uint)bVar1);
      } while (aVar4 == '\0');
      bstr_set_error(ctx,5);
      ctx_local = (bstr_context_t *)0x0;
    }
  }
  return (uint8_t *)ctx_local;
}

Assistant:

const uint8_t *bstr_parse_json_string_literal(bstr_context_t *ctx, const uint8_t *pBegin, const uint8_t *pEnd, adt_str_t *str)
{
#define NUM_ESCAPE_CHARS 8
   const uint8_t quotationMark = '"';
   const uint8_t backslash = '\\';
   const uint8_t frontslash = '/';
   const uint8_t backspace = '\b';
   const uint8_t formfeed = '\f';
   const uint8_t linefeed = '\n';
   const uint8_t carriageReturn = '\r';
   const uint8_t horizontalTab = '\t';
   const uint8_t validEscapeChars[NUM_ESCAPE_CHARS] = {
         quotationMark,
         backslash,
         frontslash,
         'b',
         'f',
         'n',
         'r',
         't'
   };
   const uint8_t escapeCharMap[NUM_ESCAPE_CHARS] = {
         quotationMark,
         backslash,
         frontslash,
         backspace,
         formfeed,
         linefeed,
         carriageReturn,
         horizontalTab,
   };

   if ( (ctx == 0) || (pBegin == 0) || (pEnd == 0) || (str == 0) || (pEnd < pBegin) )
   {
      errno = EINVAL;
      return (const uint8_t*) 0;
   }
   if (pBegin < pEnd)
   {
      uint8_t firstChar = *pBegin;
      if (firstChar == quotationMark)
      {
         const uint8_t *pNext = pBegin+1;
         bool isEscapeSequence = false;
         uint8_t escapeType = 0u;
         uint8_t numDigits = 0u;
         uint32_t value = 0u;
         while(pNext < pEnd)
         {
            uint8_t c = *pNext++;
            if (isEscapeSequence)
            {
               if (escapeType == 'u')
               {
                  if (numDigits<4)
                  {
                     value<<=4;
                     value|=ASCIIHexToInt[c];
                     numDigits++;
                  }
                  if (numDigits==4)
                  {
                     //TODO: adt_str_push does not yet support unicode, will need to fix that.
                     //TODO: JSON can contain two \u sequences in a row to allow large code points. Will implement that later.
                     adt_str_push(str, (int) value);
                     escapeType = 0u;
                     numDigits = 0u;
                     value = 0u;
                  }
               }
               else
               {
                  if (c == 'u')
                  {
                     escapeType = c;
                  }
                  else
                  {
                     int32_t i;
                     for (i=0; i<NUM_ESCAPE_CHARS; i++)
                     {
                        if (c==validEscapeChars[i])
                        {
                           break;
                        }
                     }
                     if (i < NUM_ESCAPE_CHARS)
                     {
                        adt_str_push(str, escapeCharMap[i]);
                        isEscapeSequence = false;
                     }
                     else
                     {
                        bstr_set_error(ctx, BSTR_INVALID_CHARACTER_ERROR);
                        return (const uint8_t*) 0;
                     }
                  }
               }
            }
            else
            {
               if (c == quotationMark)
               {
                  return pNext;
               }
               else if (c == backslash)
               {
                  isEscapeSequence = true;
               }
               else if (bstr_pred_is_control_char(c))
               {
                  bstr_set_error(ctx, BSTR_INVALID_CHARACTER_ERROR);
                  return (const uint8_t*) 0;
               }
               else
               {
                  adt_error_t result = adt_str_push(str, c);
                  if (result != ADT_NO_ERROR)
                  {
                     bstr_set_error(ctx, BSTR_MEM_ERROR);
                     return (const uint8_t*) 0;
                  }
               }
            }
         }
      }
   }
   return pBegin;
#undef NUM_ESCAPE_CHARS
}